

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexManipulator.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
TasGrid::MultiIndexManipulations::referencePoints<true>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,int *levels,
          OneDimensionalWrapper *wrapper,MultiIndexSet *points)

{
  ulong __n;
  pointer piVar1;
  ulong uVar2;
  int iVar3;
  iterator __begin2;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  allocator_type local_61;
  vector<int,_std::allocator<int>_> p;
  vector<int,_std::allocator<int>_> num_points;
  
  __n = points->num_dimensions;
  ::std::vector<int,_std::allocator<int>_>::vector(&num_points,__n,(allocator_type *)&p);
  piVar1 = (wrapper->num_points).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar4 = 0; __n != uVar4; uVar4 = uVar4 + 1) {
    num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4] = piVar1[levels[uVar4]];
  }
  uVar7 = 1;
  for (; num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
    uVar7 = uVar7 * *num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(long)(int)uVar7,(allocator_type *)&p);
  ::std::vector<int,_std::allocator<int>_>::vector(&p,__n,&local_61);
  uVar8 = 0;
  uVar4 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar4 = uVar8;
  }
  for (; uVar6 = __n & 0xffffffff,
      piVar5 = num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish, uVar2 = uVar8, uVar8 != uVar4; uVar8 = uVar8 + 1)
  {
    for (; piVar5 = piVar5 + -1, 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar6 - 1] = (int)uVar2 % *piVar5;
      uVar2 = (long)(int)uVar2 / (long)*piVar5;
    }
    iVar3 = MultiIndexSet::getSlot
                      (points,p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar8] = iVar3;
  }
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&p.super__Vector_base<int,_std::allocator<int>_>);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&num_points.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> referencePoints(const int levels[], const OneDimensionalWrapper &wrapper, const MultiIndexSet &points){
    size_t num_dimensions = (size_t) points.getNumDimensions();
    std::vector<int> num_points(num_dimensions);
    int num_total = 1; // this will be a subset of all points, no danger of overflow
    for(size_t j=0; j<num_dimensions; j++) num_points[j] = wrapper.getNumPoints(levels[j]);
    for(auto n : num_points) num_total *= n;

    std::vector<int> refs(num_total);
    std::vector<int> p(num_dimensions);

    for(int i=0; i<num_total; i++){
        int t = i;
        auto n = num_points.rbegin();
        for(int j=(int) num_dimensions-1; j>=0; j--){
            p[j] = (nested) ? t % *n : wrapper.getPointIndex(levels[j], t % *n);
            t /= *n++;
        }
        refs[i] = points.getSlot(p);
    }
    return refs;
}